

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateMergingMethods
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  uint uVar2;
  csharp *this_00;
  pointer ppFVar3;
  bool bVar4;
  Type TVar5;
  mapped_type *pmVar6;
  FieldGeneratorBase *pFVar7;
  Descriptor *pDVar8;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *pFVar9;
  FieldDescriptor *extraout_RDX_00;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  char *text;
  long lVar10;
  long lVar11;
  ulong uVar12;
  allocator local_d1;
  MessageGenerator *local_d0;
  key_type local_c8;
  AlphaNum local_a8;
  long local_78;
  long local_70;
  long local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0 = this;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  class_name_abi_cxx11_((string *)&local_a8,this);
  std::__cxx11::string::string((string *)&local_c8,"class_name",&local_d1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&local_d0->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,"public void MergeFrom($class_name$ other) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>(printer,"if (other == null) {\n  return;\n}\n");
  lVar11 = 0;
  for (lVar10 = 0; pDVar8 = local_d0->descriptor_, lVar10 < *(int *)(pDVar8 + 0x68);
      lVar10 = lVar10 + 1) {
    if (*(long *)(*(long *)(pDVar8 + 0x28) + 0x58 + lVar11) == 0) {
      pFVar7 = CreateFieldGeneratorInternal
                         (local_d0,(FieldDescriptor *)(*(long *)(pDVar8 + 0x28) + lVar11));
      (*(pFVar7->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[7])(pFVar7,printer);
      (*(pFVar7->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar7);
    }
    lVar11 = lVar11 + 0x98;
  }
  lVar10 = 0;
  while (lVar10 < *(int *)(pDVar8 + 0x6c)) {
    lVar11 = lVar10 * 0x30;
    UnderscoresToCamelCase
              ((string *)&local_a8,*(string **)(*(long *)(pDVar8 + 0x30) + lVar11),false);
    std::__cxx11::string::string((string *)&local_c8,"name",&local_d1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_c8);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    UnderscoresToCamelCase
              ((string *)&local_a8,*(string **)(*(long *)(local_d0->descriptor_ + 0x30) + lVar11),
               true);
    std::__cxx11::string::string((string *)&local_c8,"property_name",&local_d1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_c8);
    local_78 = lVar10;
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    io::Printer::Print(printer,&vars,"switch (other.$property_name$Case) {\n");
    io::Printer::Indent(printer);
    lVar10 = 0;
    pFVar9 = extraout_RDX;
    local_70 = lVar11;
    while (lVar10 < *(int *)(*(long *)(local_d0->descriptor_ + 0x30) + 0x18 + local_70)) {
      this_00 = *(csharp **)
                 (*(long *)(*(long *)(local_d0->descriptor_ + 0x30) + local_70 + 0x20) + lVar10 * 8)
      ;
      GetPropertyName_abi_cxx11_((string *)&local_a8,this_00,pFVar9);
      std::__cxx11::string::string((string *)&local_c8,"field_property_name",&local_d1);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_c8);
      local_68 = lVar10;
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_a8);
      io::Printer::Print(printer,&vars,"case $property_name$OneofCase.$field_property_name$:\n");
      io::Printer::Indent(printer);
      pFVar7 = CreateFieldGeneratorInternal(local_d0,(FieldDescriptor *)this_00);
      (*(pFVar7->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[7])(pFVar7,printer);
      io::Printer::Print<>(printer,"break;\n");
      io::Printer::Outdent(printer);
      (*(pFVar7->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar7);
      pFVar9 = extraout_RDX_00;
      lVar10 = local_68 + 1;
    }
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"}\n\n");
    pDVar8 = local_d0->descriptor_;
    lVar10 = local_78 + 1;
  }
  if (local_d0->has_extension_ranges_ != false) {
    io::Printer::Print<>
              (printer,"pb::ExtensionSet.MergeFrom(ref _extensions, other._extensions);\n");
  }
  io::Printer::Print<>
            (printer,
             "_unknownFields = pb::UnknownFieldSet.MergeFrom(_unknownFields, other._unknownFields);\n"
            );
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&local_d0->super_SourceGeneratorBase,printer);
  io::Printer::Print<>(printer,"public void MergeFrom(pb::CodedInputStream input) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print<>
            (printer,"uint tag;\nwhile ((tag = input.ReadTag()) != 0) {\n  switch(tag) {\n");
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  if (local_d0->end_tag_ != 0) {
    strings::AlphaNum::AlphaNum(&local_a8,local_d0->end_tag_);
    StrCat_abi_cxx11_(&local_c8,(protobuf *)&local_a8,a);
    io::Printer::Print<char[8],std::__cxx11::string>
              (printer,"$end_tag$:\n  return;\n",(char (*) [8])"end_tag",&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  text = 
  "default:\n  _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, input);\n  break;\n"
  ;
  if (local_d0->has_extension_ranges_ != false) {
    text = 
    "default:\n  if (!pb::ExtensionSet.TryMergeFieldFrom(ref _extensions, input)) {\n    _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, input);\n  }\n  break;\n"
    ;
  }
  io::Printer::Print<>(printer,text);
  for (uVar12 = 0;
      ppFVar3 = (local_d0->fields_by_number_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar12 < (ulong)((long)(local_d0->fields_by_number_).
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3 >> 3);
      uVar12 = uVar12 + 1) {
    pFVar9 = ppFVar3[uVar12];
    TVar5 = FieldDescriptor::type(pFVar9);
    iVar1 = *(int *)(pFVar9 + 0x44);
    uVar2 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar5 * 4);
    bVar4 = FieldDescriptor::is_packable(pFVar9);
    if (bVar4) {
      strings::AlphaNum::AlphaNum(&local_a8,*(int *)(pFVar9 + 0x44) * 8 + 2);
      StrCat_abi_cxx11_(&local_c8,(protobuf *)&local_a8,a_00);
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,"case $packed_tag$:\n",(char (*) [11])"packed_tag",&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    strings::AlphaNum::AlphaNum(&local_a8,iVar1 << 3 | uVar2);
    StrCat_abi_cxx11_(&local_c8,(protobuf *)&local_a8,a_01);
    io::Printer::Print<char[4],std::__cxx11::string>
              (printer,"case $tag$: {\n",(char (*) [4])0x3aa00f,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    io::Printer::Indent(printer);
    pFVar7 = CreateFieldGeneratorInternal(local_d0,pFVar9);
    (*(pFVar7->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[8])(pFVar7,printer);
    io::Printer::Print<>(printer,"break;\n");
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"}\n");
    (*(pFVar7->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar7);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateMergingMethods(io::Printer* printer) {
  // Note:  These are separate from GenerateMessageSerializationMethods()
  //   because they need to be generated even for messages that are optimized
  //   for code size.
  std::map<string, string> vars;
  vars["class_name"] = class_name();

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "public void MergeFrom($class_name$ other) {\n");
  printer->Indent();
  printer->Print(
    "if (other == null) {\n"
    "  return;\n"
    "}\n");
  // Merge non-oneof fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      std::unique_ptr<FieldGeneratorBase> generator(
          CreateFieldGeneratorInternal(descriptor_->field(i)));
      generator->GenerateMergingCode(printer);
    }
  }
  // Merge oneof fields
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    vars["name"] = UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), false);
    vars["property_name"] = UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), true);
    printer->Print(vars, "switch (other.$property_name$Case) {\n");
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      vars["field_property_name"] = GetPropertyName(field);
      printer->Print(
        vars,
        "case $property_name$OneofCase.$field_property_name$:\n");
      printer->Indent();
      std::unique_ptr<FieldGeneratorBase> generator(CreateFieldGeneratorInternal(field));
      generator->GenerateMergingCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Outdent();
    printer->Print("}\n\n");
  }
  // Merge extensions
  if (has_extension_ranges_) {
    printer->Print("pb::ExtensionSet.MergeFrom(ref _extensions, other._extensions);\n");
  }

  // Merge unknown fields.
  printer->Print(
      "_unknownFields = pb::UnknownFieldSet.MergeFrom(_unknownFields, other._unknownFields);\n");

  printer->Outdent();
  printer->Print("}\n\n");


  WriteGeneratedCodeAttributes(printer);
  printer->Print("public void MergeFrom(pb::CodedInputStream input) {\n");
  printer->Indent();
  printer->Print(
    "uint tag;\n"
    "while ((tag = input.ReadTag()) != 0) {\n"
    "  switch(tag) {\n");
  printer->Indent();
  printer->Indent();
  if (end_tag_ != 0) {
    printer->Print(
      "$end_tag$:\n"
      "  return;\n",
      "end_tag", StrCat(end_tag_));
  }
  if (has_extension_ranges_) {
    printer->Print(
      "default:\n"
      "  if (!pb::ExtensionSet.TryMergeFieldFrom(ref _extensions, input)) {\n"
      "    _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, input);\n"
      "  }\n"
      "  break;\n");
  } else {
    printer->Print(
      "default:\n"
      "  _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, input);\n"
      "  break;\n");
  }
  for (int i = 0; i < fields_by_number().size(); i++) {
    const FieldDescriptor* field = fields_by_number()[i];
    internal::WireFormatLite::WireType wt =
        internal::WireFormat::WireTypeForFieldType(field->type());
    uint32 tag = internal::WireFormatLite::MakeTag(field->number(), wt);
    // Handle both packed and unpacked repeated fields with the same Read*Array call;
    // the two generated cases are the packed and unpacked tags.
    // TODO(jonskeet): Check that is_packable is equivalent to
    // is_repeated && wt in { VARINT, FIXED32, FIXED64 }.
    // It looks like it is...
    if (field->is_packable()) {
      printer->Print(
        "case $packed_tag$:\n",
        "packed_tag",
        StrCat(
            internal::WireFormatLite::MakeTag(
                field->number(),
                internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED)));
    }

    printer->Print("case $tag$: {\n", "tag", StrCat(tag));
    printer->Indent();
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(field));
    generator->GenerateParsingCode(printer);
    printer->Print("break;\n");
    printer->Outdent();
    printer->Print("}\n");
  }
  printer->Outdent();
  printer->Print("}\n"); // switch
  printer->Outdent();
  printer->Print("}\n"); // while
  printer->Outdent();
  printer->Print("}\n\n"); // method
}